

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O1

TPZTransform<double> *
pzshape::TPZShapeQuad::ParametricTransform
          (TPZTransform<double> *__return_storage_ptr__,int trans_id)

{
  long lVar1;
  long lVar2;
  
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,2,2);
  lVar2 = (long)trans_id * 0x20;
  if (((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
       super_TPZBaseMatrix.fRow < 1) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(__return_storage_ptr__->fMult).super_TPZFMatrix<double>.fElem = *(double *)(gTrans2dQ + lVar2);
  if (((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
       super_TPZBaseMatrix.fRow < 1) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar1 = (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.fElem[lVar1] =
       *(double *)(gTrans2dQ + lVar2 + 8);
  if ((lVar1 < 2) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.fElem[1] =
       *(double *)(gTrans2dQ + lVar2 + 0x10);
  if ((1 < (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
           super_TPZBaseMatrix.fRow) &&
     (1 < (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fCol)) {
    (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.fElem
    [(__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
     super_TPZBaseMatrix.fRow + 1] = *(double *)(gTrans2dQ + lVar2 + 0x18);
    return __return_storage_ptr__;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

TPZTransform<REAL> TPZShapeQuad::ParametricTransform(int trans_id){
        TPZTransform<REAL> trans(2,2);
        trans.Mult()(0,0) = gTrans2dQ[trans_id][0][0];
        trans.Mult()(0,1) = gTrans2dQ[trans_id][0][1];
        trans.Mult()(1,0) = gTrans2dQ[trans_id][1][0];
        trans.Mult()(1,1) = gTrans2dQ[trans_id][1][1];
        return trans;
    }